

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O2

State QUnicodeTools::LB::BRS::updateState(State state,LinebreakUnit lb)

{
  State SVar1;
  LineBreakClass LVar2;
  char32_t cVar3;
  
  LVar2 = lb.lbc;
  if (LVar2 == LineBreak_CM) {
    return state;
  }
  cVar3 = lb.ucs4;
  switch(state) {
  case None:
    if (cVar3 != L'◌') {
      return (State)((LVar2 - LineBreak_AK & 0xfffffffd) == 0);
    }
    SVar1 = Start;
    break;
  case Start:
    if (LVar2 == LineBreak_VF) {
      SVar1 = LB28a_2VF;
    }
    else if (LVar2 == LineBreak_VI) {
      SVar1 = LB28a_2VI;
    }
    else {
      if (cVar3 != L'◌') {
        return (uint)((LVar2 - LineBreak_AK & 0xfffffffd) == 0) * 5;
      }
      SVar1 = LB28a_4;
    }
    break;
  default:
    return None;
  case LB28a_2VI:
    if (LVar2 != LineBreak_AK && cVar3 != L'◌') {
      return None;
    }
    return LB28a_3VIAK;
  case LB28a_4:
    return LVar2 == LineBreak_VF ^ Restart;
  }
  return SVar1;
}

Assistant:

State updateState(State state, LinebreakUnit lb)
    {
        using LBC = QUnicodeTables::LineBreakClass;
        if (lb.lbc == LBC::LineBreak_CM)
            return state;

        switch (state) {
        case Start:
            if (lb.lbc == LBC::LineBreak_VF)
                return LB28a_2VF;
            if (lb.lbc == LBC::LineBreak_VI)
                return LB28a_2VI;
            if (lb.ucs4 == DottedCircle || lb.lbc == LBC::LineBreak_AK
                || lb.lbc == LBC::LineBreak_AS)
                return LB28a_4;
            break;
        case LB28a_2VI:
            if (lb.ucs4 == DottedCircle || lb.lbc == LBC::LineBreak_AK)
                return LB28a_3VIAK;
            break;
        case LB28a_4:
            if (lb.lbc == LBC::LineBreak_VF)
                return LB28a_4VF;
            // Had (AK | [◌] | AS) (AK | [◌] | AS), which could mean the 2nd capture is the start
            // of a new sequence, so we need to check if it makes sense.
            return Restart;
        case None:
            if (Q_UNLIKELY(lb.ucs4 == DottedCircle || lb.lbc == LBC::LineBreak_AK
                           || lb.lbc == LBC::LineBreak_AS)) {
                return Start;
            }
            break;
        case LB28a_2VF:
        case LB28a_4VF:
        case LB28a_3VIAK:
        case Restart:
            // These are all terminal states, so no need to update
            Q_UNREACHABLE();
        }
        return None;
    }